

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisAngularAccelerometerSensor.cpp
# Opt level: O2

void __thiscall
iDynTree::ThreeAxisAngularAccelerometerSensor::~ThreeAxisAngularAccelerometerSensor
          (ThreeAxisAngularAccelerometerSensor *this)

{
  ThreeAxisAngularAccelerometerPrivateAttributes *this_00;
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor =
       (_func_int **)&PTR__ThreeAxisAngularAccelerometerSensor_001e6ab8;
  this_00 = this->pimpl;
  if (this_00 != (ThreeAxisAngularAccelerometerPrivateAttributes *)0x0) {
    ThreeAxisAngularAccelerometerPrivateAttributes::~ThreeAxisAngularAccelerometerPrivateAttributes
              (this_00);
  }
  operator_delete(this_00,0xa8);
  LinkSensor::~LinkSensor(&this->super_LinkSensor);
  return;
}

Assistant:

ThreeAxisAngularAccelerometerSensor::~ThreeAxisAngularAccelerometerSensor()
{
    delete this->pimpl;
}